

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

void __thiscall
diligent_spirv_cross::Compiler::analyze_variable_scope
          (Compiler *this,SPIRFunction *entry,AnalyzeVariableScopeAccessHandler *handler)

{
  _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *this_00;
  ID *__k;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var1;
  __ireturn_type *p_Var2;
  bool bVar3;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  iterator iVar7;
  SPIRBlock *pSVar8;
  iterator iVar9;
  TypedID<(diligent_spirv_cross::Types)2> *pTVar10;
  SPIRType *pSVar11;
  mapped_type *pmVar12;
  mapped_type *pmVar13;
  SPIRVariable *pSVar14;
  iterator iVar15;
  size_type sVar16;
  uint *ts;
  SmallVector<unsigned_int,_8UL> *pSVar17;
  SmallVector<unsigned_int,_8UL> *pSVar18;
  value_type *__v;
  value_type *__v_00;
  uint32_t uVar19;
  uint block_00;
  long lVar20;
  _Hash_node_base _Var21;
  TypedID<(diligent_spirv_cross::Types)6> *block_id;
  TypedID<(diligent_spirv_cross::Types)6> *__k_00;
  __node_base *p_Var22;
  __node_base _Var23;
  SmallVector<std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>>,8ul>
  *this_01;
  bool static_loop_init;
  uint32_t dominating_block;
  BlockID block;
  unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  *__range1;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  seen_blocks;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  potential_loop_variables;
  bool local_f9;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_f8;
  CFG *local_f0;
  anon_class_16_2_2fc8764d local_e8;
  __ireturn_type *local_d8;
  SPIRBlock *local_d0;
  key_type local_c4;
  SPIRFunction *local_c0;
  _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_b8;
  __ireturn_type *local_b0;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_a8;
  undefined1 local_a0 [56];
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  traverse_all_reachable_opcodes(this,entry,&handler->super_OpcodeHandler);
  local_68._M_buckets =
       (__buckets_ptr)CONCAT44(local_68._M_buckets._4_4_,(entry->super_IVariant).self.id);
  iVar7 = ::std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->function_cfgs)._M_h,(key_type_conflict *)&local_68);
  local_f0 = *(CFG **)((long)iVar7.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<diligent_spirv_cross::CFG,_std::default_delete<diligent_spirv_cross::CFG>_>_>,_false>
                             ._M_cur + 0x10);
  local_a8 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&handler->accessed_variables_to_block;
  local_d0 = (SPIRBlock *)handler;
  analyze_parameter_preservation
            (this,entry,local_f0,
             (unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
              *)local_a8,&handler->complete_write_variables_to_block);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  __k_00 = (entry->blocks).
           super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>.ptr;
  local_b8 = &(this->ir).continue_block_to_loop_header._M_h;
  for (lVar20 = (entry->blocks).
                super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>.
                buffer_size << 2; lVar20 != 0; lVar20 = lVar20 + -4) {
    pSVar8 = get<diligent_spirv_cross::SPIRBlock>(this,__k_00->id);
    iVar9 = ::std::
            _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(local_b8,__k_00);
    if (((iVar9.
          super__Node_iterator_base<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_true>
          ._M_cur == (__node_type *)0x0) ||
        (uVar5 = *(uint32_t *)
                  ((long)iVar9.
                         super__Node_iterator_base<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_true>
                         ._M_cur + 0xc), uVar5 == __k_00->id)) &&
       (uVar5 = CFG::find_loop_dominator(local_f0,__k_00->id), uVar5 == __k_00->id)) {
      (pSVar8->loop_dominator).id = 0xffffffff;
    }
    else {
      (pSVar8->loop_dominator).id = uVar5;
    }
    __k_00 = __k_00 + 1;
  }
  p_Var22 = &(((unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                *)&local_d0->next_block)->_M_h)._M_before_begin;
  local_c0 = entry;
LAB_0069115e:
  do {
    p_Var22 = p_Var22->_M_nxt;
    if (p_Var22 == (__node_base *)0x0) break;
    pTVar10 = (entry->local_variables).
              super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>.ptr;
    local_a0._0_4_ = (int)*(size_type *)(p_Var22 + 1);
    pTVar10 = ::std::
              __find_if<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>*,__gnu_cxx::__ops::_Iter_equals_val<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>const>>
                        (pTVar10,pTVar10 + (entry->local_variables).
                                           super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>
                                           .buffer_size,(DominatorBuilder *)local_a0);
    if (pTVar10 !=
        (entry->local_variables).
        super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>.ptr +
        (entry->local_variables).
        super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>.buffer_size
       ) {
      DominatorBuilder::DominatorBuilder((DominatorBuilder *)local_a0,local_f0);
      local_f8 = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(p_Var22 + 1);
      pSVar11 = expression_type(this,(uint32_t)*(size_type *)local_f8);
      _Var21._M_nxt = p_Var22 + 4;
      uVar5 = 0;
      while (_Var21._M_nxt = (_Var21._M_nxt)->_M_nxt, _Var21._M_nxt != (_Hash_node_base *)0x0) {
        block_00 = *(uint *)&_Var21._M_nxt[1]._M_nxt;
        if (((this->ir).block_meta.super_VectorView<unsigned_char>.ptr[block_00] & 2) != 0) {
          local_e8.blocks = (mapped_type *)CONCAT44(local_e8.blocks._4_4_,block_00);
          pmVar12 = ::std::__detail::
                    _Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)local_b8,(key_type *)&local_e8);
          DominatorBuilder::add_block((DominatorBuilder *)local_a0,pmVar12->id);
          if (((pSVar11->vecsize == 1) && (pSVar11->columns == 1)) &&
             ((pSVar11->basetype != Struct &&
              ((pSVar11->array).super_VectorView<unsigned_int>.buffer_size == 0)))) {
            block_00 = *(uint *)&_Var21._M_nxt[1]._M_nxt;
            uVar5 = -(uint)(uVar5 != 0) | block_00;
          }
          else {
            block_00 = *(uint *)&_Var21._M_nxt[1]._M_nxt;
          }
        }
        DominatorBuilder::add_block((DominatorBuilder *)local_a0,block_00);
      }
      DominatorBuilder::lift_continue_block_dominator((DominatorBuilder *)local_a0);
      entry = local_c0;
      uVar19 = local_a0._8_4_;
      if (local_a0._8_4_ == 0) {
        if (uVar5 + 1 < 2) goto LAB_0069115e;
LAB_006912e8:
        pmVar13 = ::std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&local_68,(key_type *)local_f8);
        *pmVar13 = uVar5;
        if (uVar19 == 0) goto LAB_0069115e;
      }
      else if (1 < uVar5 + 1) {
        pSVar8 = get<diligent_spirv_cross::SPIRBlock>(this,local_a0._8_4_);
        if (pSVar8->merge != MergeLoop) {
          uVar6 = (pSVar8->loop_dominator).id;
          if (uVar6 == 0xffffffff) goto LAB_006912e8;
          pSVar8 = get<diligent_spirv_cross::SPIRBlock>(this,uVar6);
        }
        uVar6 = (pSVar8->merge_block).id;
        local_d8 = (__ireturn_type *)CONCAT44(local_d8._4_4_,uVar6);
        if ((uVar6 == 0) || (bVar3 = CFG::is_reachable(local_f0,uVar6), !bVar3)) goto LAB_006912e8;
        bVar3 = CFG::is_reachable(local_f0,uVar5);
        if (bVar3) {
          uVar6 = CFG::get_visit_order(local_f0,(uint32_t)local_d8);
          local_d8 = (__ireturn_type *)CONCAT44(local_d8._4_4_,uVar6);
          uVar6 = CFG::get_visit_order(local_f0,uVar5);
          if ((uint32_t)local_d8 <= uVar6) goto LAB_006912e8;
        }
      }
      pSVar14 = get<diligent_spirv_cross::SPIRVariable>(this,*(uint32_t *)local_f8);
      if (pSVar14->phi_variable == false) {
        pSVar8 = get<diligent_spirv_cross::SPIRBlock>(this,uVar19);
        bVar3 = may_read_undefined_variable_in_block(this,pSVar8,*(uint32_t *)local_f8);
        if (bVar3) {
          while (uVar5 = (pSVar8->loop_dominator).id, uVar5 != 0xffffffff) {
            pSVar8 = get<diligent_spirv_cross::SPIRBlock>(this,uVar5);
          }
          uVar5 = (pSVar8->super_IVariant).self.id;
          if (uVar5 != uVar19) {
            DominatorBuilder::add_block((DominatorBuilder *)local_a0,uVar5);
            uVar19 = local_a0._8_4_;
          }
          if (uVar19 == 0) goto LAB_0069115e;
        }
      }
      pSVar8 = get<diligent_spirv_cross::SPIRBlock>(this,uVar19);
      p_Var1 = local_f8;
      local_e8.blocks = (mapped_type *)CONCAT44(local_e8.blocks._4_4_,*(uint32_t *)local_f8);
      SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_8UL>::push_back
                (&pSVar8->dominated_variables,(TypedID<(diligent_spirv_cross::Types)2> *)&local_e8);
      pSVar14 = get<diligent_spirv_cross::SPIRVariable>(this,*(uint32_t *)p_Var1);
      (pSVar14->dominator).id = uVar19;
    }
  } while( true );
  p_Var22 = &(((unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                *)((long)local_d0 + 0x50))->_M_h)._M_before_begin;
  local_f8 = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)((long)local_d0 + 0x88);
  local_d0 = (SPIRBlock *)((long)local_d0 + 0x130);
  local_d8 = (__ireturn_type *)&this->hoisted_temporaries;
  local_b0 = (__ireturn_type *)&this->forced_temporaries;
LAB_006913f5:
  p_Var22 = p_Var22->_M_nxt;
  if (p_Var22 != (__node_base *)0x0) {
    this_00 = (_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               *)(p_Var22 + 1);
    iVar15 = ::std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(local_f8,(key_type_conflict *)this_00);
    if ((iVar15.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
         != (__node_type *)0x0) &&
       ((pSVar11 = get<diligent_spirv_cross::SPIRType>
                             (this,*(uint32_t *)
                                    ((long)iVar15.
                                           super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                           ._M_cur + 0xc)), pSVar11->pointer != false ||
        (pSVar11->basetype - AccelerationStructure < 0xfffffffd)))) {
      DominatorBuilder::DominatorBuilder((DominatorBuilder *)local_a0,local_f0);
      local_c0 = (SPIRFunction *)(p_Var22 + 2);
      _Var21._M_nxt = p_Var22 + 4;
      bVar3 = false;
      while (_Var21._M_nxt = (_Var21._M_nxt)->_M_nxt, _Var21._M_nxt != (_Hash_node_base *)0x0) {
        DominatorBuilder::add_block
                  ((DominatorBuilder *)local_a0,*(uint32_t *)&_Var21._M_nxt[1]._M_nxt);
        if ((p_Var22[5]._M_nxt != (_Hash_node_base *)0x1) &&
           (((this->ir).block_meta.super_VectorView<unsigned_char>.ptr
             [*(uint *)&_Var21._M_nxt[1]._M_nxt] & 2) != 0)) {
          local_e8.blocks =
               (mapped_type *)CONCAT44(local_e8.blocks._4_4_,*(uint *)&_Var21._M_nxt[1]._M_nxt);
          pmVar12 = ::std::__detail::
                    _Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)local_b8,(key_type *)&local_e8);
          pSVar8 = get<diligent_spirv_cross::SPIRBlock>(this,pmVar12->id);
          if (pSVar8->merge != MergeLoop) {
            __assert_fail("loop_header_block.merge == SPIRBlock::MergeLoop",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Cross/spirv_cross.cpp"
                          ,0x1015,
                          "void diligent_spirv_cross::Compiler::analyze_variable_scope(SPIRFunction &, AnalyzeVariableScopeAccessHandler &)"
                         );
          }
          bVar3 = true;
          DominatorBuilder::add_block((DominatorBuilder *)local_a0,(pSVar8->super_IVariant).self.id)
          ;
        }
      }
      local_e8.blocks = (mapped_type *)CONCAT44(local_e8.blocks._4_4_,local_a0._8_4_);
      if (p_Var22[5]._M_nxt == (_Hash_node_base *)0x1) {
        bVar4 = false;
        uVar5 = local_a0._8_4_;
      }
      else {
        bVar4 = is_single_block_loop(this,local_a0._8_4_);
        uVar5 = (uint32_t)local_e8.blocks;
      }
      if (uVar5 != 0) {
        sVar16 = ::std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                          *)local_c0,(key_type_conflict *)&local_e8);
        if ((~bVar4 & sVar16 != 0) == 0) {
          sVar16 = ::std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                            *)local_d0,(key_type_conflict *)this_00);
          if (sVar16 != 0) {
            if (bVar3) {
              pSVar8 = get<diligent_spirv_cross::SPIRBlock>(this,(uint32_t)local_e8.blocks);
              if (pSVar8->merge != MergeLoop) {
                __assert_fail("loop_header_block.merge == SPIRBlock::MergeLoop",
                              "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Cross/spirv_cross.cpp"
                              ,0x103d,
                              "void diligent_spirv_cross::Compiler::analyze_variable_scope(SPIRFunction &, AnalyzeVariableScopeAccessHandler &)"
                             );
              }
              pSVar8->complex_continue = true;
            }
            goto LAB_006913f5;
          }
          ::std::__detail::
          _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::insert(local_d8,this_00,__v);
          ::std::__detail::
          _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::insert(local_b0,this_00,__v_00);
          pSVar8 = get<diligent_spirv_cross::SPIRBlock>(this,(uint32_t)local_e8.blocks);
          ts = ::std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)local_f8,(key_type *)this_00);
          this_01 = (SmallVector<std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>>,8ul>
                     *)&pSVar8->declare_temporary;
        }
        else {
          if (p_Var22[5]._M_nxt < (_Hash_node_base *)0x2) goto LAB_006913f5;
          pSVar8 = get<diligent_spirv_cross::SPIRBlock>(this,(uint32_t)local_e8.blocks);
          ts = ::std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)local_f8,(key_type *)this_00);
          this_01 = (SmallVector<std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>>,8ul>
                     *)&pSVar8->potential_declare_temporary;
        }
        SmallVector<std::pair<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>>,8ul>
        ::emplace_back<unsigned_int&,unsigned_int_const&>(this_01,ts,(uint *)this_00);
      }
    }
    goto LAB_006913f5;
  }
  local_a0._0_8_ = local_a0 + 0x30;
  local_a0._8_8_ = 1;
  local_a0._16_8_ = (_Hash_node_base *)0x0;
  local_a0._24_8_ = 0;
  local_a0._32_4_ = 1.0;
  local_a0._40_8_ = 0;
  local_a0._48_8_ = (__node_base_ptr)0x0;
  _Var23._M_nxt = local_68._M_before_begin._M_nxt;
  do {
    if ((SPIRFunction *)_Var23._M_nxt == (SPIRFunction *)0x0) {
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)local_a0);
      ::std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_68);
      return;
    }
    pSVar14 = get<diligent_spirv_cross::SPIRVariable>
                        (this,(((SPIRFunction *)_Var23._M_nxt)->super_IVariant).self.id);
    uVar5 = (pSVar14->dominator).id;
    local_c4.id = *(uint32_t *)&(((SPIRFunction *)_Var23._M_nxt)->super_IVariant).field_0xc;
    if ((1 < local_c4.id + 1) && (uVar5 != 0)) {
      iVar9 = ::std::
              _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(local_b8,&local_c4);
      if (iVar9.
          super__Node_iterator_base<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        pSVar8 = get<diligent_spirv_cross::SPIRBlock>(this,local_c4.id);
        uVar19 = (pSVar8->continue_block).id;
        if (uVar19 != local_c4.id) goto LAB_006917e8;
      }
      else {
        uVar19 = *(uint32_t *)
                  ((long)iVar9.
                         super__Node_iterator_base<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>,_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)6>_>,_true>
                         ._M_cur + 0xc);
      }
      if (uVar19 == 0) {
LAB_006917e8:
        __assert_fail("header",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Cross/spirv_cross.cpp"
                      ,0x107b,
                      "void diligent_spirv_cross::Compiler::analyze_variable_scope(SPIRFunction &, AnalyzeVariableScopeAccessHandler &)"
                     );
      }
      local_d0 = get<diligent_spirv_cross::SPIRBlock>(this,uVar19);
      __k = &(((SPIRFunction *)_Var23._M_nxt)->super_IVariant).self;
      local_f8 = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)::std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[](local_a8,&__k->id);
      local_e8.blocks = (mapped_type *)CONCAT44(local_e8.blocks._4_4_,uVar19);
      local_d8 = (__ireturn_type *)__k;
      local_c0 = (SPIRFunction *)_Var23._M_nxt;
      sVar16 = ::std::
               _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)local_f8,(key_type_conflict *)&local_e8);
      bVar3 = sVar16 != 0;
      local_f9 = true;
      while (uVar5 != uVar19) {
        local_e8.blocks = (mapped_type *)CONCAT44(local_e8.blocks._4_4_,uVar5);
        sVar16 = ::std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                          *)local_f8,(key_type_conflict *)&local_e8);
        pSVar17 = CFG::get_succeeding_edges(local_f0,uVar5);
        _Var23._M_nxt = (_Hash_node_base *)local_c0;
        if ((((pSVar17->super_VectorView<unsigned_int>).buffer_size != 1) ||
            (pSVar18 = CFG::get_preceding_edges
                                 (local_f0,*(pSVar17->super_VectorView<unsigned_int>).ptr),
            _Var23._M_nxt = (_Hash_node_base *)local_c0,
            (pSVar18->super_VectorView<unsigned_int>).buffer_size != 1)) ||
           (*(pSVar18->super_VectorView<unsigned_int>).ptr != uVar5)) goto LAB_006917b7;
        bVar3 = (bool)(bVar3 | sVar16 != 0);
        uVar5 = *(pSVar17->super_VectorView<unsigned_int>).ptr;
      }
      _Var23._M_nxt = (_Hash_node_base *)local_c0;
      if ((bVar3 & local_f9) != 0) {
        ::std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::clear((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_a0);
        local_e8.blocks = (mapped_type *)local_f8;
        local_e8.static_loop_init = &local_f9;
        CFG::
        walk_from<diligent_spirv_cross::Compiler::analyze_variable_scope(diligent_spirv_cross::SPIRFunction&,diligent_spirv_cross::Compiler::AnalyzeVariableScopeAccessHandler&)::__0>
                  (local_f0,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)local_a0,(local_d0->merge_block).id,&local_e8);
        pSVar8 = local_d0;
        p_Var2 = local_d8;
        _Var23._M_nxt = (_Hash_node_base *)local_c0;
        if (local_f9 != false) {
          local_e8.blocks =
               (mapped_type *)
               CONCAT44(local_e8.blocks._4_4_,
                        *(uint32_t *)&((_Hashtable *)&local_d8->first)->_M_buckets);
          SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_8UL>::push_back
                    (&local_d0->loop_variables,(TypedID<(diligent_spirv_cross::Types)2> *)&local_e8)
          ;
          pTVar10 = (pSVar8->loop_variables).
                    super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>
                    .ptr;
          ::std::
          __sort<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>*,__gnu_cxx::__ops::_Iter_less_iter>
                    (pTVar10,pTVar10 + (pSVar8->loop_variables).
                                       super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>
                                       .buffer_size);
          pSVar14 = get<diligent_spirv_cross::SPIRVariable>
                              (this,*(uint32_t *)&((_Hashtable *)&p_Var2->first)->_M_buckets);
          pSVar14->loop_variable = true;
          _Var23._M_nxt = (_Hash_node_base *)local_c0;
        }
      }
    }
LAB_006917b7:
    _Var23._M_nxt =
         (_Hash_node_base *)(((SPIRFunction *)_Var23._M_nxt)->super_IVariant)._vptr_IVariant;
  } while( true );
}

Assistant:

void Compiler::analyze_variable_scope(SPIRFunction &entry, AnalyzeVariableScopeAccessHandler &handler)
{
	// First, we map out all variable access within a function.
	// Essentially a map of block -> { variables accessed in the basic block }
	traverse_all_reachable_opcodes(entry, handler);

	auto &cfg = *function_cfgs.find(entry.self)->second;

	// Analyze if there are parameters which need to be implicitly preserved with an "in" qualifier.
	analyze_parameter_preservation(entry, cfg, handler.accessed_variables_to_block,
	                               handler.complete_write_variables_to_block);

	unordered_map<uint32_t, uint32_t> potential_loop_variables;

	// Find the loop dominator block for each block.
	for (auto &block_id : entry.blocks)
	{
		auto &block = get<SPIRBlock>(block_id);

		auto itr = ir.continue_block_to_loop_header.find(block_id);
		if (itr != end(ir.continue_block_to_loop_header) && itr->second != block_id)
		{
			// Continue block might be unreachable in the CFG, but we still like to know the loop dominator.
			// Edge case is when continue block is also the loop header, don't set the dominator in this case.
			block.loop_dominator = itr->second;
		}
		else
		{
			uint32_t loop_dominator = cfg.find_loop_dominator(block_id);
			if (loop_dominator != block_id)
				block.loop_dominator = loop_dominator;
			else
				block.loop_dominator = SPIRBlock::NoDominator;
		}
	}

	// For each variable which is statically accessed.
	for (auto &var : handler.accessed_variables_to_block)
	{
		// Only deal with variables which are considered local variables in this function.
		if (find(begin(entry.local_variables), end(entry.local_variables), VariableID(var.first)) ==
		    end(entry.local_variables))
			continue;

		DominatorBuilder builder(cfg);
		auto &blocks = var.second;
		auto &type = expression_type(var.first);
		BlockID potential_continue_block = 0;

		// Figure out which block is dominating all accesses of those variables.
		for (auto &block : blocks)
		{
			// If we're accessing a variable inside a continue block, this variable might be a loop variable.
			// We can only use loop variables with scalars, as we cannot track static expressions for vectors.
			if (is_continue(block))
			{
				// Potentially awkward case to check for.
				// We might have a variable inside a loop, which is touched by the continue block,
				// but is not actually a loop variable.
				// The continue block is dominated by the inner part of the loop, which does not make sense in high-level
				// language output because it will be declared before the body,
				// so we will have to lift the dominator up to the relevant loop header instead.
				builder.add_block(ir.continue_block_to_loop_header[block]);

				// Arrays or structs cannot be loop variables.
				if (type.vecsize == 1 && type.columns == 1 && type.basetype != SPIRType::Struct && type.array.empty())
				{
					// The variable is used in multiple continue blocks, this is not a loop
					// candidate, signal that by setting block to -1u.
					if (potential_continue_block == 0)
						potential_continue_block = block;
					else
						potential_continue_block = ~(0u);
				}
			}

			builder.add_block(block);
		}

		builder.lift_continue_block_dominator();

		// Add it to a per-block list of variables.
		BlockID dominating_block = builder.get_dominator();

		if (dominating_block && potential_continue_block != 0 && potential_continue_block != ~0u)
		{
			auto &inner_block = get<SPIRBlock>(dominating_block);

			BlockID merge_candidate = 0;

			// Analyze the dominator. If it lives in a different loop scope than the candidate continue
			// block, reject the loop variable candidate.
			if (inner_block.merge == SPIRBlock::MergeLoop)
				merge_candidate = inner_block.merge_block;
			else if (inner_block.loop_dominator != SPIRBlock::NoDominator)
				merge_candidate = get<SPIRBlock>(inner_block.loop_dominator).merge_block;

			if (merge_candidate != 0 && cfg.is_reachable(merge_candidate))
			{
				// If the merge block has a higher post-visit order, we know that continue candidate
				// cannot reach the merge block, and we have two separate scopes.
				if (!cfg.is_reachable(potential_continue_block) ||
				    cfg.get_visit_order(merge_candidate) > cfg.get_visit_order(potential_continue_block))
				{
					potential_continue_block = 0;
				}
			}
		}

		if (potential_continue_block != 0 && potential_continue_block != ~0u)
			potential_loop_variables[var.first] = potential_continue_block;

		// For variables whose dominating block is inside a loop, there is a risk that these variables
		// actually need to be preserved across loop iterations. We can express this by adding
		// a "read" access to the loop header.
		// In the dominating block, we must see an OpStore or equivalent as the first access of an OpVariable.
		// Should that fail, we look for the outermost loop header and tack on an access there.
		// Phi nodes cannot have this problem.
		if (dominating_block)
		{
			auto &variable = get<SPIRVariable>(var.first);
			if (!variable.phi_variable)
			{
				auto *block = &get<SPIRBlock>(dominating_block);
				bool preserve = may_read_undefined_variable_in_block(*block, var.first);
				if (preserve)
				{
					// Find the outermost loop scope.
					while (block->loop_dominator != BlockID(SPIRBlock::NoDominator))
						block = &get<SPIRBlock>(block->loop_dominator);

					if (block->self != dominating_block)
					{
						builder.add_block(block->self);
						dominating_block = builder.get_dominator();
					}
				}
			}
		}

		// If all blocks here are dead code, this will be 0, so the variable in question
		// will be completely eliminated.
		if (dominating_block)
		{
			auto &block = get<SPIRBlock>(dominating_block);
			block.dominated_variables.push_back(var.first);
			get<SPIRVariable>(var.first).dominator = dominating_block;
		}
	}

	for (auto &var : handler.accessed_temporaries_to_block)
	{
		auto itr = handler.result_id_to_type.find(var.first);

		if (itr == end(handler.result_id_to_type))
		{
			// We found a false positive ID being used, ignore.
			// This should probably be an assert.
			continue;
		}

		// There is no point in doing domination analysis for opaque types.
		auto &type = get<SPIRType>(itr->second);
		if (type_is_opaque_value(type))
			continue;

		DominatorBuilder builder(cfg);
		bool force_temporary = false;
		bool used_in_header_hoisted_continue_block = false;

		// Figure out which block is dominating all accesses of those temporaries.
		auto &blocks = var.second;
		for (auto &block : blocks)
		{
			builder.add_block(block);

			if (blocks.size() != 1 && is_continue(block))
			{
				// The risk here is that inner loop can dominate the continue block.
				// Any temporary we access in the continue block must be declared before the loop.
				// This is moot for complex loops however.
				auto &loop_header_block = get<SPIRBlock>(ir.continue_block_to_loop_header[block]);
				assert(loop_header_block.merge == SPIRBlock::MergeLoop);
				builder.add_block(loop_header_block.self);
				used_in_header_hoisted_continue_block = true;
			}
		}

		uint32_t dominating_block = builder.get_dominator();

		if (blocks.size() != 1 && is_single_block_loop(dominating_block))
		{
			// Awkward case, because the loop header is also the continue block,
			// so hoisting to loop header does not help.
			force_temporary = true;
		}

		if (dominating_block)
		{
			// If we touch a variable in the dominating block, this is the expected setup.
			// SPIR-V normally mandates this, but we have extra cases for temporary use inside loops.
			bool first_use_is_dominator = blocks.count(dominating_block) != 0;

			if (!first_use_is_dominator || force_temporary)
			{
				if (handler.access_chain_expressions.count(var.first))
				{
					// Exceptionally rare case.
					// We cannot declare temporaries of access chains (except on MSL perhaps with pointers).
					// Rather than do that, we force the indexing expressions to be declared in the right scope by
					// tracking their usage to that end. There is no temporary to hoist.
					// However, we still need to observe declaration order of the access chain.

					if (used_in_header_hoisted_continue_block)
					{
						// For this scenario, we used an access chain inside a continue block where we also registered an access to header block.
						// This is a problem as we need to declare an access chain properly first with full definition.
						// We cannot use temporaries for these expressions,
						// so we must make sure the access chain is declared ahead of time.
						// Force a complex for loop to deal with this.
						// TODO: Out-of-order declaring for loops where continue blocks are emitted last might be another option.
						auto &loop_header_block = get<SPIRBlock>(dominating_block);
						assert(loop_header_block.merge == SPIRBlock::MergeLoop);
						loop_header_block.complex_continue = true;
					}
				}
				else
				{
					// This should be very rare, but if we try to declare a temporary inside a loop,
					// and that temporary is used outside the loop as well (spirv-opt inliner likes this)
					// we should actually emit the temporary outside the loop.
					hoisted_temporaries.insert(var.first);
					forced_temporaries.insert(var.first);

					auto &block_temporaries = get<SPIRBlock>(dominating_block).declare_temporary;
					block_temporaries.emplace_back(handler.result_id_to_type[var.first], var.first);
				}
			}
			else if (blocks.size() > 1)
			{
				// Keep track of the temporary as we might have to declare this temporary.
				// This can happen if the loop header dominates a temporary, but we have a complex fallback loop.
				// In this case, the header is actually inside the for (;;) {} block, and we have problems.
				// What we need to do is hoist the temporaries outside the for (;;) {} block in case the header block
				// declares the temporary.
				auto &block_temporaries = get<SPIRBlock>(dominating_block).potential_declare_temporary;
				block_temporaries.emplace_back(handler.result_id_to_type[var.first], var.first);
			}
		}
	}

	unordered_set<uint32_t> seen_blocks;

	// Now, try to analyze whether or not these variables are actually loop variables.
	for (auto &loop_variable : potential_loop_variables)
	{
		auto &var = get<SPIRVariable>(loop_variable.first);
		auto dominator = var.dominator;
		BlockID block = loop_variable.second;

		// The variable was accessed in multiple continue blocks, ignore.
		if (block == BlockID(~(0u)) || block == BlockID(0))
			continue;

		// Dead code.
		if (dominator == ID(0))
			continue;

		BlockID header = 0;

		// Find the loop header for this block if we are a continue block.
		{
			auto itr = ir.continue_block_to_loop_header.find(block);
			if (itr != end(ir.continue_block_to_loop_header))
			{
				header = itr->second;
			}
			else if (get<SPIRBlock>(block).continue_block == block)
			{
				// Also check for self-referential continue block.
				header = block;
			}
		}

		assert(header);
		auto &header_block = get<SPIRBlock>(header);
		auto &blocks = handler.accessed_variables_to_block[loop_variable.first];

		// If a loop variable is not used before the loop, it's probably not a loop variable.
		bool has_accessed_variable = blocks.count(header) != 0;

		// Now, there are two conditions we need to meet for the variable to be a loop variable.
		// 1. The dominating block must have a branch-free path to the loop header,
		// this way we statically know which expression should be part of the loop variable initializer.

		// Walk from the dominator, if there is one straight edge connecting
		// dominator and loop header, we statically know the loop initializer.
		bool static_loop_init = true;
		while (dominator != header)
		{
			if (blocks.count(dominator) != 0)
				has_accessed_variable = true;

			auto &succ = cfg.get_succeeding_edges(dominator);
			if (succ.size() != 1)
			{
				static_loop_init = false;
				break;
			}

			auto &pred = cfg.get_preceding_edges(succ.front());
			if (pred.size() != 1 || pred.front() != dominator)
			{
				static_loop_init = false;
				break;
			}

			dominator = succ.front();
		}

		if (!static_loop_init || !has_accessed_variable)
			continue;

		// The second condition we need to meet is that no access after the loop
		// merge can occur. Walk the CFG to see if we find anything.

		seen_blocks.clear();
		cfg.walk_from(seen_blocks, header_block.merge_block, [&](uint32_t walk_block) -> bool {
			// We found a block which accesses the variable outside the loop.
			if (blocks.find(walk_block) != end(blocks))
				static_loop_init = false;
			return true;
		});

		if (!static_loop_init)
			continue;

		// We have a loop variable.
		header_block.loop_variables.push_back(loop_variable.first);
		// Need to sort here as variables come from an unordered container, and pushing stuff in wrong order
		// will break reproducability in regression runs.
		sort(begin(header_block.loop_variables), end(header_block.loop_variables));
		get<SPIRVariable>(loop_variable.first).loop_variable = true;
	}
}